

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::getDefinedRegs
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,shared_ptr<mocker::nasm::Inst> *inst)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  element_type *peVar5;
  shared_ptr<mocker::nasm::Inst> *v;
  shared_ptr<mocker::nasm::Register> *psVar6;
  long lVar7;
  bool bVar8;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_00;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_01;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_02;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_03;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_04;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_05;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_06;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_07;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_08;
  shared_ptr<mocker::nasm::Register> reg;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Register> local_150;
  shared_ptr<mocker::nasm::Addr> local_140;
  undefined8 uStack_130;
  shared_ptr<mocker::nasm::Register> local_128;
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  shared_ptr<mocker::nasm::Inst> *local_88;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_128,inst);
  peVar5 = local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar8 = true;
  local_88 = inst;
  if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_40,inst);
    if (local_40 == 0) {
      dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_50,inst);
      if (local_50 == 0) {
        dyc<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_60,inst);
        if (local_60 == 0) {
          dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_70,inst)
          ;
          if (local_70 == 0) {
            dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_80,inst)
            ;
            bVar8 = local_80 != 0;
            bVar1 = true;
            bVar2 = true;
            bVar3 = true;
            bVar4 = true;
            goto LAB_001a5e05;
          }
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        bVar3 = true;
      }
      else {
        bVar2 = false;
        bVar3 = false;
      }
      bVar1 = false;
      bVar4 = true;
      bVar8 = true;
      goto LAB_001a5e05;
    }
  }
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
LAB_001a5e05:
  if ((bVar1) && (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if ((bVar2) && (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((bVar3) && (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if ((bVar4) && (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if ((peVar5 == (element_type *)0x0) &&
     (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  v = local_88;
  if (bVar8) {
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_128,local_88);
    peVar5 = local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->identifier)._M_dataplus._M_p;
      local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->identifier)._M_string_length;
      if (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                ((nasm *)&local_150,&local_140);
      if (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_150.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        (__return_storage_ptr__->
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &(local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_Addr;
        local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        __l._M_len = 1;
        __l._M_array = (iterator)&local_140;
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::vector(__return_storage_ptr__,__l,(allocator_type *)((long)&uStack_130 + 7));
        if (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_140.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_150.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
    }
    if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (peVar5 == (element_type *)0x0) {
      dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_128,v);
      peVar5 = local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->identifier)._M_dataplus._M_p;
        local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->identifier)._M_string_length;
        if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        __l_00._M_len = 1;
        __l_00._M_array = &local_150;
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::vector(__return_storage_ptr__,__l_00,(allocator_type *)&local_140);
        if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_150.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (peVar5 == (element_type *)0x0) {
        dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_128,v)
        ;
        peVar5 = local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               ((local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->identifier)._M_string_length;
          local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->identifier).field_2._M_allocated_capacity;
          if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          __l_01._M_len = 1;
          __l_01._M_array = &local_150;
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::vector(__return_storage_ptr__,__l_01,(allocator_type *)&local_140);
          if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_150.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (peVar5 == (element_type *)0x0) {
          dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((nasm *)&local_128,v);
          peVar5 = local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0) {
            dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
                      ((nasm *)&local_150,
                       (shared_ptr<mocker::nasm::Addr> *)
                       &((local_128.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->identifier)._M_string_length);
            __l_02._M_len = 1;
            __l_02._M_array = (iterator)&local_150;
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::vector(__return_storage_ptr__,__l_02,(allocator_type *)&local_140);
            if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_150.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (peVar5 == (element_type *)0x0) {
            dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_150,v);
            peVar5 = local_150.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              psVar6 = rax();
              local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (psVar6->
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_128.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_128.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              psVar6 = rcx();
              local_118 = (psVar6->
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
              local_110 = (psVar6->
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi;
              if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_110->_M_use_count = local_110->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_110->_M_use_count = local_110->_M_use_count + 1;
                }
              }
              psVar6 = rdx();
              local_108 = (psVar6->
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
              local_100 = (psVar6->
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi;
              if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_100->_M_use_count = local_100->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_100->_M_use_count = local_100->_M_use_count + 1;
                }
              }
              psVar6 = rsp();
              local_f8 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
              local_f0 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
              if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_f0->_M_use_count = local_f0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_f0->_M_use_count = local_f0->_M_use_count + 1;
                }
              }
              psVar6 = rsi();
              local_e8 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
              local_e0 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
              if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_e0->_M_use_count = local_e0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_e0->_M_use_count = local_e0->_M_use_count + 1;
                }
              }
              psVar6 = rdi();
              local_d8 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
              local_d0 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
              if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_d0->_M_use_count = local_d0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_d0->_M_use_count = local_d0->_M_use_count + 1;
                }
              }
              psVar6 = r8();
              local_c8 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
              local_c0 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
              if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_c0->_M_use_count = local_c0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_c0->_M_use_count = local_c0->_M_use_count + 1;
                }
              }
              psVar6 = r9();
              local_b8 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
              local_b0 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
              if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_b0->_M_use_count = local_b0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_b0->_M_use_count = local_b0->_M_use_count + 1;
                }
              }
              psVar6 = r10();
              local_a8 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
              local_a0 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
              if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_a0->_M_use_count = local_a0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_a0->_M_use_count = local_a0->_M_use_count + 1;
                }
              }
              psVar6 = r11();
              local_98 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
              local_90 = (psVar6->
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
              if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_90->_M_use_count = local_90->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_90->_M_use_count = local_90->_M_use_count + 1;
                }
              }
              __l_03._M_len = 10;
              __l_03._M_array = &local_128;
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::vector(__return_storage_ptr__,__l_03,(allocator_type *)&local_140);
              lVar7 = 0xa0;
              do {
                if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_130 + lVar7) !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                              ((long)&uStack_130 + lVar7));
                }
                lVar7 = lVar7 + -0x10;
              } while (lVar7 != 0);
            }
            if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_150.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (peVar5 == (element_type *)0x0) {
              dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_128,v)
              ;
              peVar5 = local_128.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)
                         ((local_128.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->identifier)._M_dataplus._M_p;
                local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((local_128.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->identifier)._M_string_length;
                if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_150.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_150.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_150.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_150.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                __l_04._M_len = 1;
                __l_04._M_array = &local_150;
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::vector(__return_storage_ptr__,__l_04,(allocator_type *)&local_140);
                if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_150.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
              }
              if (local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_128.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (peVar5 == (element_type *)0x0) {
                dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((nasm *)&local_150,v);
                peVar5 = local_150.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (element_type *)0x0) {
                  psVar6 = rsp();
                  local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (psVar6->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  local_128.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (psVar6->
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if (local_128.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_128.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_128.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_128.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_128.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  psVar6 = rbp();
                  local_118 = (psVar6->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr;
                  local_110 = (psVar6->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              )._M_refcount._M_pi;
                  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      local_110->_M_use_count = local_110->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      local_110->_M_use_count = local_110->_M_use_count + 1;
                    }
                  }
                  __l_05._M_len = 2;
                  __l_05._M_array = &local_128;
                  std::
                  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ::vector(__return_storage_ptr__,__l_05,(allocator_type *)&local_140);
                  lVar7 = 0x20;
                  do {
                    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)&uStack_130 + lVar7) !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                  ((long)&uStack_130 + lVar7));
                    }
                    lVar7 = lVar7 + -0x10;
                  } while (lVar7 != 0);
                }
                if (local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_150.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (peVar5 == (element_type *)0x0) {
                  dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>
                            ((nasm *)&local_128,v);
                  peVar5 = local_128.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  if (local_128.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      != (element_type *)0x0) {
                    local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)
                              ((local_128.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->identifier)._M_string_length;
                    local_150.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((local_128.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->identifier).field_2._M_allocated_capacity;
                    if (local_150.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_150.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_150.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_150.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_150.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    __l_06._M_len = 1;
                    __l_06._M_array = &local_150;
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::vector(__return_storage_ptr__,__l_06,(allocator_type *)&local_140);
                    if (local_150.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_150.
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                  }
                  if (local_128.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_128.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                  if (peVar5 == (element_type *)0x0) {
                    dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                              ((nasm *)&local_150,v);
                    peVar5 = local_150.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    if (local_150.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr != (element_type *)0x0) {
                      psVar6 = rax();
                      local_128.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           = (psVar6->
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                             ._M_ptr;
                      local_128.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (psVar6->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                      if (local_128.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (local_128.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_128.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (local_128.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_128.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      psVar6 = rdx();
                      local_118 = (psVar6->
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr;
                      local_110 = (psVar6->
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_refcount._M_pi;
                      if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          local_110->_M_use_count = local_110->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          local_110->_M_use_count = local_110->_M_use_count + 1;
                        }
                      }
                      __l_07._M_len = 2;
                      __l_07._M_array = &local_128;
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::vector(__return_storage_ptr__,__l_07,(allocator_type *)&local_140);
                      lVar7 = 0x20;
                      do {
                        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             ((long)&uStack_130 + lVar7) !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                      ((long)&uStack_130 + lVar7));
                        }
                        lVar7 = lVar7 + -0x10;
                      } while (lVar7 != 0);
                    }
                    if (local_150.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_150.
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    if (peVar5 == (element_type *)0x0) {
                      dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                                ((nasm *)&local_128,v);
                      peVar5 = local_128.
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      if (local_128.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr != (element_type *)0x0) {
                        psVar6 = rdx();
                        local_150.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr = (psVar6->
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr;
                        local_150.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi =
                             (psVar6->
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                             ._M_refcount._M_pi;
                        if (local_150.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                           ) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            (local_150.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count =
                                 (local_150.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            (local_150.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count =
                                 (local_150.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_M_use_count + 1;
                          }
                        }
                        __l_08._M_len = 1;
                        __l_08._M_array = &local_150;
                        std::
                        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ::vector(__return_storage_ptr__,__l_08,(allocator_type *)&local_140);
                        if (local_150.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                           ) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_150.
                                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
                        }
                      }
                      if (local_128.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_128.
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
                      }
                      if (peVar5 == (element_type *)0x0) {
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                      ,0x83,
                                      "std::vector<std::shared_ptr<Register>> mocker::nasm::getDefinedRegs(const std::shared_ptr<Inst> &)"
                                     );
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Register>>
getDefinedRegs(const std::shared_ptr<Inst> &inst) {
  if (dyc<Empty>(inst) || dyc<Ret>(inst) || dyc<Push>(inst) || dyc<Jmp>(inst) ||
      dyc<CJump>(inst) || dyc<Cmp>(inst)) {
    return {};
  }
  if (auto p = dyc<Mov>(inst)) {
    if (auto reg = dyc<nasm::Register>(p->getDest()))
      return {reg};
    return {};
  }
  if (auto p = dyc<Lea>(inst)) {
    return {p->getDest()};
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return {dyc<Register>(p->getLhs())};
  }
  if (auto p = dyc<Call>(inst)) {
    return {rax(), rcx(), rdx(), rsp(), rsi(), rdi(), r8(), r9(), r10(), r11()};
  }
  if (auto p = dyc<Pop>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<Leave>(inst)) {
    return {rsp(), rbp()};
  }
  if (auto p = dyc<Set>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<IDiv>(inst)) {
    return {rax(), rdx()};
  }
  if (auto p = dyc<Cqo>(inst)) {
    return {rdx()};
  }
  assert(false);
}